

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O2

bool __thiscall
Jinx::Impl::Parser::CheckPropertyName
          (Parser *this,LibraryIPtr *library,SymbolListCItr currSym,size_t *symCount)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  size_t i;
  size_t sVar4;
  Symbol *pSVar5;
  String name;
  
  if (((this->m_error == false) &&
      ((this->m_symbolList->
       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
       super__Vector_impl_data._M_finish != currSym._M_current)) &&
     ((currSym._M_current)->type == NameValue)) {
    uVar2 = ((library->super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->m_maxPropertyParts;
    while( true ) {
      if (uVar2 == 0) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
                (&name,&(currSym._M_current)->text);
      sVar3 = 1;
      pSVar5 = currSym._M_current + 1;
      for (sVar4 = sVar3; sVar4 < uVar2; sVar4 = sVar4 + 1) {
        if (((this->m_error == false) &&
            (pSVar5 != (this->m_symbolList->
                       super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)
                       ._M_impl.super__Vector_impl_data._M_finish)) &&
           ((pSVar5->type != NewLine && ((pSVar5->text)._M_string_length != 0)))) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                    (&name," ");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::append
                    (&name,&pSVar5->text);
          sVar3 = sVar3 + 1;
        }
        pSVar5 = pSVar5 + 1;
      }
      bVar1 = Library::PropertyNameExists
                        ((library->
                         super___shared_ptr<Jinx::Impl::Library,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         ,&name);
      if (bVar1) {
        if (symCount != (size_t *)0x0) {
          *symCount = sVar3;
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(&name);
        return true;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
      ~basic_string(&name);
      uVar2 = uVar2 - 1;
    }
  }
  return false;
}

Assistant:

inline_t bool Parser::CheckPropertyName(LibraryIPtr library, SymbolListCItr currSym, size_t * symCount) const
	{
		// Internal function called once we've established a library to check
		// Check up to the max number of parts

		// Initial error checks
		if (m_error || currSym == m_symbolList.end())
			return false;
		if (currSym->type != SymbolType::NameValue)
			return false;

		// Check for names starting with max property count
		auto maxParts = library->GetMaxPropertyParts();
		for (size_t s = maxParts; s > 0; --s)
		{
			auto curr = currSym;
			auto name = String(curr->text);
			size_t sc = 1;
			for (size_t i = 1; i < s; ++i)
			{
				++curr;
				if (!IsSymbolValid(curr) || curr->text.empty())
					continue;
				name += " ";
				name += curr->text;
				++sc;
			}
			bool exists = library->PropertyNameExists(name);
			if (exists)
			{
				if (symCount)
					*symCount = sc;
				return true;
			}
		}
		return false;
	}